

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O3

void __thiscall
onmt::Tokenizer::finalize_tokens
          (Tokenizer *this,vector<onmt::Token,_std::allocator<onmt::Token>_> *annotated_tokens,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *features)

{
  bool bVar1;
  uint uVar2;
  pointer pbVar3;
  pointer pcVar4;
  pointer pvVar5;
  size_type sVar6;
  char cVar7;
  long lVar8;
  pointer pTVar9;
  long *plVar10;
  Casing CVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  string *psVar13;
  byte bVar14;
  byte bVar15;
  string *psVar16;
  pointer pbVar17;
  undefined8 uVar18;
  undefined1 *puVar19;
  _Alloc_hider _Var20;
  long lVar21;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *pvVar22;
  size_t j;
  ulong uVar23;
  _Alloc_hider _Var24;
  string final_token;
  string local_188;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_168;
  Casing local_15c;
  undefined1 *local_158;
  ulong local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_168 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)tokens;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(tokens,((long)(annotated_tokens->
                          super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(annotated_tokens->
                          super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  pTVar9 = (annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if ((annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
      super__Vector_impl_data._M_finish != pTVar9) {
    pbVar17 = (pTVar9->features).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (pTVar9->features).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar17 != pbVar3) {
      lVar8 = (long)pbVar3 - (long)pbVar17 >> 5;
      goto LAB_001b379e;
    }
  }
  lVar8 = 0;
LAB_001b379e:
  lVar8 = (ulong)(this->_options).case_feature + lVar8;
  if (lVar8 != 0) {
    do {
      local_188._M_dataplus._M_p = local_188._M_dataplus._M_p & 0xffffffff00000000;
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::emplace_back<int>(features,(int *)&local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((features->
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish + -1,
                ((long)(annotated_tokens->
                       super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(annotated_tokens->
                       super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  local_150 = 0;
  _Var24._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
  if ((this->_options).case_markup != false) {
    get_case_markups((vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *)
                     &local_188,annotated_tokens,(this->_options).soft_case_regions);
    local_150 = local_188.field_2._M_allocated_capacity;
    _Var24._M_p = local_188._M_dataplus._M_p;
  }
  pTVar9 = (annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if ((annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
      super__Vector_impl_data._M_finish != pTVar9) {
    psVar13 = &(this->_options).joiner;
    puVar19 = (undefined1 *)0x0;
    local_148 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var24._M_p;
    local_120 = annotated_tokens;
    local_f8 = psVar13;
    do {
      CVar11 = (Casing)psVar13;
      pTVar9 = pTVar9 + (long)puVar19;
      local_15c = pTVar9->casing;
      pbVar17 = (pTVar9->features).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_158 = puVar19;
      if (pbVar17 !=
          (pTVar9->features).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar21 = 0;
        lVar8 = 0;
        uVar23 = 0;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&(((features->
                                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data + lVar8),
                      (value_type *)((long)&(pbVar17->_M_dataplus)._M_p + lVar21));
          CVar11 = (Casing)psVar13;
          uVar23 = uVar23 + 1;
          pbVar17 = (pTVar9->features).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = lVar8 + 0x18;
          lVar21 = lVar21 + 0x20;
        } while (uVar23 < (ulong)((long)(pTVar9->features).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar17
                                 >> 5));
      }
      _Var24._M_p = (pointer)local_148;
      if (((this->_options).case_markup == true) &&
         (uVar2 = *(uint *)((long)local_148 + (long)local_158 * 0xc), uVar2 != 0)) {
        write_case_markup_abi_cxx11_
                  (&local_188,(onmt *)(ulong)uVar2,
                   *(CaseMarkupType *)((long)local_148 + (long)local_158 * 0xc + 8),CVar11);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_168,&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
      }
      pvVar22 = local_120;
      bVar1 = pTVar9->preserve;
      if ((this->_options).joiner_annotate == true) {
        psVar13 = (string *)0x0;
        if (pTVar9->join_left != false) {
          psVar13 = local_f8;
        }
        if (local_158 == (undefined1 *)0x0) {
          psVar13 = (string *)0x0;
        }
        psVar16 = (string *)0x0;
        if ((pTVar9->join_right == true) &&
           (psVar16 = (string *)0x0,
           local_158 + 1 <
           (undefined1 *)
           (((long)(local_120->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(local_120->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7))) {
          psVar16 = local_f8;
        }
        bVar14 = (this->_options).joiner_new ^ 1;
        bVar15 = 0;
        if (pTVar9->spacer != false) {
          bVar15 = bVar14;
        }
        if (bVar1 == false) {
          bVar15 = bVar14;
        }
      }
      else if ((this->_options).spacer_annotate == true) {
        if (local_158 == (undefined1 *)0x0) {
          if (pTVar9->spacer != false) goto LAB_001b39c9;
LAB_001b39ec:
          psVar13 = (string *)0x0;
        }
        else {
          if ((pTVar9->join_left != false) ||
             ((local_120->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
              super__Vector_impl_data._M_start[(long)(puVar19 + -1)].join_right != false))
          goto LAB_001b39ec;
LAB_001b39c9:
          psVar13 = (string *)&spacer_marker_abi_cxx11_;
        }
        bVar15 = (this->_options).spacer_new ^ 1;
        if (bVar1 != false) {
          bVar15 = 0;
        }
        psVar16 = (string *)0x0;
      }
      else {
        psVar13 = (string *)0x0;
        psVar16 = (string *)0x0;
        bVar15 = bVar1 ^ 1;
      }
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((ulong)psVar13 | (ulong)psVar16);
      if (paVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar1 = (this->_options).case_feature;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar4 = (pTVar9->surface)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar4,pcVar4 + (pTVar9->surface)._M_string_length);
        CVar11 = (Casing)paVar12;
        if ((local_50._M_string_length != 0) &&
           (std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_168,&local_50), bVar1 != false)) {
          pvVar5 = (features->
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_188._M_dataplus._M_p._0_4_ = 1;
          cVar7 = casing_to_char(local_15c);
          local_140._M_dataplus._M_p._0_4_ = CONCAT31(local_140._M_dataplus._M_p._1_3_,cVar7);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<int,char>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (pvVar5 + -1),(int *)&local_188,(char *)&local_140);
        }
        uVar18 = local_50.field_2._M_allocated_capacity;
        _Var20._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_001b3f18:
          operator_delete(_Var20._M_p,uVar18 + 1);
        }
      }
      else if ((bVar15 & 1) == 0) {
        if (psVar13 != (string *)0x0) {
          bVar1 = (this->_options).case_feature;
          paVar12 = &local_70.field_2;
          pcVar4 = (psVar13->_M_dataplus)._M_p;
          local_70._M_dataplus._M_p = (pointer)paVar12;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar4,pcVar4 + psVar13->_M_string_length);
          if ((local_70._M_string_length != 0) &&
             (std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_168,&local_70), pvVar22 = local_120,
             bVar1 != false)) {
            pvVar5 = (features->
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            local_188._M_dataplus._M_p._0_4_ = 1;
            cVar7 = casing_to_char(None);
            local_140._M_dataplus._M_p._0_4_ = CONCAT31(local_140._M_dataplus._M_p._1_3_,cVar7);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<int,char>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       (pvVar5 + -1),(int *)&local_188,(char *)&local_140);
            pvVar22 = local_120;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        CVar11 = (Casing)paVar12;
        bVar1 = (this->_options).case_feature;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar4 = (pTVar9->surface)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar4,pcVar4 + (pTVar9->surface)._M_string_length);
        if ((local_90._M_string_length != 0) &&
           (std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_168,&local_90), bVar1 != false)) {
          pvVar5 = (features->
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_188._M_dataplus._M_p._0_4_ = 1;
          cVar7 = casing_to_char(local_15c);
          local_140._M_dataplus._M_p._0_4_ = CONCAT31(local_140._M_dataplus._M_p._1_3_,cVar7);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<int,char>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (pvVar5 + -1),(int *)&local_188,(char *)&local_140);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (psVar16 != (string *)0x0) {
          bVar1 = (this->_options).case_feature;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          pcVar4 = (psVar16->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar4,pcVar4 + psVar16->_M_string_length);
          if ((local_b0._M_string_length != 0) &&
             (std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_168,&local_b0), bVar1 != false)) {
            pvVar5 = (features->
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            local_188._M_dataplus._M_p._0_4_ = 1;
            cVar7 = casing_to_char(None);
            local_140._M_dataplus._M_p._0_4_ = CONCAT31(local_140._M_dataplus._M_p._1_3_,cVar7);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<int,char>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       (pvVar5 + -1),(int *)&local_188,(char *)&local_140);
          }
          uVar18 = local_b0.field_2._M_allocated_capacity;
          _Var20._M_p = local_b0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_001b3f18;
        }
      }
      else {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        if (psVar13 == (string *)0x0) {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
        }
        else {
          pcVar4 = (psVar13->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,pcVar4,pcVar4 + psVar13->_M_string_length);
        }
        std::operator+(&local_140,&local_118,&pTVar9->surface);
        local_d0[0] = local_c0;
        if (psVar16 == (string *)0x0) {
          std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
        }
        else {
          pcVar4 = (psVar16->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,pcVar4,pcVar4 + psVar16->_M_string_length);
        }
        plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_d0[0]);
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 == paVar12) {
          local_188.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_188.field_2._8_8_ = plVar10[3];
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        }
        else {
          local_188.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_188._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_188._M_string_length = plVar10[1];
        *plVar10 = (long)paVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_140._M_dataplus._M_p._4_4_,local_140._M_dataplus._M_p._0_4_) !=
            &local_140.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_140._M_dataplus._M_p._4_4_,local_140._M_dataplus._M_p._0_4_
                                  ),local_140.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        sVar6 = local_188._M_string_length;
        bVar1 = (this->_options).case_feature;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        paVar12 = &local_188.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p == paVar12) {
          local_f0.field_2._8_8_ = local_188.field_2._8_8_;
        }
        else {
          local_f0._M_dataplus._M_p = local_188._M_dataplus._M_p;
        }
        local_f0.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
        local_f0._M_string_length = local_188._M_string_length;
        local_188._M_string_length = 0;
        local_188.field_2._M_allocated_capacity =
             local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_188._M_dataplus._M_p = (pointer)paVar12;
        if ((sVar6 != 0) &&
           (std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_168,&local_f0), bVar1 != false)) {
          pvVar5 = (features->
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_140._M_dataplus._M_p._0_4_ = 1;
          cVar7 = casing_to_char(local_15c);
          local_118._M_dataplus._M_p._0_1_ = cVar7;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<int,char>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (pvVar5 + -1),(int *)&local_140,(char *)&local_118);
        }
        CVar11 = (Casing)paVar12;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        uVar18 = local_188.field_2._M_allocated_capacity;
        _Var20._M_p = local_188._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) goto LAB_001b3f18;
      }
      if (((this->_options).case_markup == true) &&
         (uVar2 = *(uint *)((long)_Var24._M_p + (long)local_158 * 0xc + 4), uVar2 != 0)) {
        write_case_markup_abi_cxx11_
                  (&local_188,(onmt *)(ulong)uVar2,
                   *(CaseMarkupType *)((long)_Var24._M_p + (long)local_158 * 0xc + 8),CVar11);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_168,&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
      }
      puVar19 = local_158 + 1;
      pTVar9 = (pvVar22->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      psVar13 = (string *)
                (((long)(pvVar22->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pTVar9 >> 3) *
                -0x71c71c71c71c71c7);
    } while (puVar19 < psVar13);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var24._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(_Var24._M_p,local_150 - (long)_Var24._M_p);
  }
  return;
}

Assistant:

void Tokenizer::finalize_tokens(const std::vector<Token>& annotated_tokens,
                                  std::vector<std::string>& tokens,
                                  std::vector<std::vector<std::string>>& features) const
  {
    tokens.reserve(annotated_tokens.size());
    size_t num_features = 0;
    if (annotated_tokens.size() > 0 && annotated_tokens[0].has_features())
      num_features = annotated_tokens[0].features.size();
    if (_options.case_feature)
      num_features += 1;

    for (size_t i = 0; i < num_features; ++i)
    {
      features.emplace_back(0);
      features.back().reserve(annotated_tokens.size());
    }

    std::vector<TokenCaseMarkup> case_markups;
    if (_options.case_markup)
      case_markups = get_case_markups(annotated_tokens, _options.soft_case_regions);

    for (size_t i = 0; i < annotated_tokens.size(); ++i)
    {
      const auto& token = annotated_tokens[i];
      const auto& str = token.surface;
      const auto casing = token.casing;

      if (token.has_features())
      {
        const auto& token_features = token.features;
        for (size_t j = 0; j < token_features.size(); ++j)
          features[j].push_back(token_features[j]);
      }

      if (_options.case_markup && case_markups[i].prefix != CaseMarkupType::None)
        tokens.emplace_back(write_case_markup(case_markups[i].prefix, case_markups[i].casing));

      const std::string* prefix = nullptr;
      const std::string* suffix = nullptr;
      bool attach = !token.preserve;

      if (_options.joiner_annotate)
      {
        if (token.join_left && i > 0)
          prefix = &_options.joiner;
        if (token.join_right && i + 1 < annotated_tokens.size())
          suffix = &_options.joiner;
        if (token.spacer)
          attach = true;  // Ignore preserve flag for spacers in joiner mode.
        attach = attach && !_options.joiner_new;
      }
      else if (_options.spacer_annotate)
      {
        if ((i == 0 && token.spacer)
            || (i > 0 && !token.join_left && !annotated_tokens[i - 1].join_right))
          prefix = &spacer_marker;
        attach = attach && !_options.spacer_new;
      }

      if (!prefix && !suffix)
        add_final_token(tokens, features, _options.case_feature, str, casing);
      else if (attach)
      {
        std::string final_token = (prefix ? *prefix : "") + str + (suffix ? *suffix : "");
        add_final_token(tokens, features, _options.case_feature, std::move(final_token), casing);
      }
      else
      {
        if (prefix)
          add_final_token(tokens, features, _options.case_feature, *prefix);
        add_final_token(tokens, features, _options.case_feature, str, casing);
        if (suffix)
          add_final_token(tokens, features, _options.case_feature, *suffix);
      }

      if (_options.case_markup && case_markups[i].suffix != CaseMarkupType::None)
        tokens.emplace_back(write_case_markup(case_markups[i].suffix, case_markups[i].casing));
    }
  }